

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitCompoundStatement
          (DeclarationBinder *this,CompoundStatementSyntax *node)

{
  Action AVar1;
  Action AVar2;
  
  pushNewScope(this,(SyntaxNode *)node,Block,true);
  AVar1 = SyntaxVisitor::
          visit<psy::C::StatementSyntax*,psy::C::SyntaxNodePlainList<psy::C::StatementSyntax*>>
                    (&this->super_SyntaxVisitor,
                     &node->stmts_->
                      super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                    );
  AVar2 = Quit;
  if (AVar1 != Quit) {
    std::deque<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>::pop_back(&(this->scopes_).c);
    AVar2 = Skip;
  }
  return AVar2;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitCompoundStatement(const CompoundStatementSyntax* node)
{
    pushNewScope(node, ScopeKind::Block, true);
    VISIT(node->statements());
    popScope();

    return Action::Skip;
}